

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

tbx_t * tbx_index_load(char *fn)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  tbx_t *tbx;
  hts_idx_t *idx;
  uint8_t *puVar4;
  size_t sVar5;
  uint8_t *ss;
  int l_meta;
  
  tbx = (tbx_t *)calloc(1,0x28);
  idx = hts_idx_load(fn,2);
  tbx->idx = idx;
  if ((idx != (hts_idx_t *)0x0) &&
     (puVar4 = hts_idx_get_meta(idx,&l_meta), puVar4 != (uint8_t *)0x0)) {
    iVar1 = *(int *)(puVar4 + 0x18);
    uVar2 = *(undefined8 *)(puVar4 + 0x10);
    (tbx->conf).meta_char = (int)uVar2;
    (tbx->conf).line_skip = (int)((ulong)uVar2 >> 0x20);
    uVar2 = *(undefined8 *)puVar4;
    uVar3 = *(undefined8 *)(puVar4 + 8);
    (tbx->conf).preset = (int)uVar2;
    (tbx->conf).sc = (int)((ulong)uVar2 >> 0x20);
    (tbx->conf).bc = (int)uVar3;
    (tbx->conf).ec = (int)((ulong)uVar3 >> 0x20);
    for (ss = puVar4 + 0x1c; (long)ss - (long)(puVar4 + 0x1c) < (long)iVar1; ss = ss + sVar5 + 1) {
      get_tid(tbx,(char *)ss,1);
      sVar5 = strlen((char *)ss);
    }
    return tbx;
  }
  free(tbx);
  return (tbx_t *)0x0;
}

Assistant:

tbx_t *tbx_index_load(const char *fn)
{
    tbx_t *tbx;
    uint8_t *meta;
    char *nm, *p;
    uint32_t x[7];
    int l_meta, l_nm;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->idx = hts_idx_load(fn, HTS_FMT_TBI);
    if ( !tbx->idx )
    {
        free(tbx);
        return NULL;
    }
    meta = hts_idx_get_meta(tbx->idx, &l_meta);
    if ( !meta )
    {
        free(tbx);
        return NULL;
    }
    memcpy(x, meta, 28);
    memcpy(&tbx->conf, x, 24);
    p = nm = (char*)meta + 28;
    l_nm = x[6];
    for (; p - nm < l_nm; p += strlen(p) + 1) get_tid(tbx, p, 1);
    return tbx;
}